

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector3 * vector3_normalize(vector3 *self)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  
  uVar2 = *(ulong *)&self->field_0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar2;
  fVar5 = (float)(uVar2 >> 0x20);
  fVar1 = (self->field_0).v[2];
  fVar5 = SQRT(fVar1 * fVar1 + (float)uVar2 * (float)uVar2 + fVar5 * fVar5);
  if (1e-05 <= fVar5) {
    auVar3._4_4_ = fVar5;
    auVar3._0_4_ = fVar5;
    auVar3._8_8_ = 0;
    auVar4 = divps(auVar4,auVar3);
    *(long *)&self->field_0 = auVar4._0_8_;
    (self->field_0).v[2] = fVar1 / fVar5;
  }
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_normalize(struct vector3 *self)
{
	HYP_FLOAT mag;

	mag = vector3_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;

	return self;
}